

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall soul::AST::Graph::addSpecialisationParameter(Graph *this,VariableDeclaration *v)

{
  pool_ref<soul::AST::ASTObject> local_38 [3];
  pool_ref<soul::AST::VariableDeclaration> local_20;
  VariableDeclaration *local_18;
  VariableDeclaration *v_local;
  Graph *this_local;
  
  local_18 = v;
  v_local = (VariableDeclaration *)this;
  pool_ref<soul::AST::VariableDeclaration>::pool_ref<soul::AST::VariableDeclaration,void>
            (&local_20,v);
  std::
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ::push_back(&this->constants,&local_20);
  pool_ref<soul::AST::VariableDeclaration>::~pool_ref(&local_20);
  pool_ref<soul::AST::ASTObject>::pool_ref<soul::AST::VariableDeclaration,void>(local_38,local_18);
  std::
  vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
  ::push_back(&(this->super_ProcessorBase).super_ModuleBase.specialisationParams,local_38);
  pool_ref<soul::AST::ASTObject>::~pool_ref(local_38);
  return;
}

Assistant:

void addSpecialisationParameter (VariableDeclaration& v) override
        {
            constants.push_back (v);
            specialisationParams.push_back (v);
        }